

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O2

pair<const_int_*,_const_int_*> __thiscall
frozen::unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  const_iterator pvVar1;
  pair<const_int_*,_const_int_*> pVar2;
  
  pVar2.first = find<int>(this,key);
  pvVar1 = pVar2.first + 1;
  if (pVar2.first == (const_iterator)&this->field_0x4) {
    pvVar1 = (const_iterator)&this->field_0x4;
  }
  pVar2.second = pvVar1;
  return pVar2;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }